

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::CopyColumn(Matrix *this,int source_column,int destination_column)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int row;
  long lVar5;
  
  if (source_column == destination_column) {
    bVar3 = false;
  }
  else {
    lVar4 = 0;
    bVar3 = false;
    for (lVar5 = 0; lVar5 < this->n_; lVar5 = lVar5 + 1) {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar4);
      bVar2 = operator!=((Fraction *)(lVar1 + (long)destination_column * 8),
                         (Fraction *)(lVar1 + (long)source_column * 8));
      if (bVar2) {
        lVar1 = *(long *)((long)&(((this->elements_).
                                   super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                                 super__Vector_impl_data + lVar4);
        *(undefined8 *)(lVar1 + (long)destination_column * 8) =
             *(undefined8 *)(lVar1 + (long)source_column * 8);
        bVar3 = true;
      }
      lVar4 = lVar4 + 0x18;
    }
  }
  return bVar3;
}

Assistant:

bool Matrix::CopyColumn(int source_column, int destination_column) {
  if (source_column == destination_column) {
    return false;
  }

  bool result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][destination_column] != elements_[row][source_column]) {
      result = true;
      elements_[row][destination_column] = elements_[row][source_column];
    }
  }

  return result;
}